

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock.h
# Opt level: O0

uint32_t __thiscall
absl::lts_20240722::base_internal::SpinLock::TryLockInternal
          (SpinLock *this,uint32_t lock_value,uint32_t wait_cycles)

{
  bool bVar1;
  __int_type _Var2;
  uint local_44;
  uint32_t sched_disabled_bit;
  uint32_t wait_cycles_local;
  uint32_t lock_value_local;
  SpinLock *this_local;
  uint local_28;
  undefined4 local_24;
  undefined4 local_20;
  uint local_1c;
  uint32_t *local_18;
  SpinLock *local_10;
  
  this_local._0_4_ = lock_value;
  if ((lock_value & 1) == 0) {
    local_44 = 0;
    sched_disabled_bit = lock_value;
    _wait_cycles_local = this;
    if (((lock_value & 2) == 0) && (bVar1 = SchedulingGuard::DisableRescheduling(), bVar1)) {
      local_44 = 4;
    }
    local_28 = sched_disabled_bit | wait_cycles | local_44 | 1;
    local_18 = &sched_disabled_bit;
    local_20 = 2;
    local_24 = 0;
    LOCK();
    _Var2 = (this->lockword_).super___atomic_base<unsigned_int>._M_i;
    this_local._7_1_ = sched_disabled_bit == _Var2;
    if ((bool)this_local._7_1_) {
      (this->lockword_).super___atomic_base<unsigned_int>._M_i = local_28;
      _Var2 = sched_disabled_bit;
    }
    UNLOCK();
    if (!(bool)this_local._7_1_) {
      sched_disabled_bit = _Var2;
      local_1c = local_28;
      local_10 = this;
      SchedulingGuard::EnableRescheduling(local_44 != 0);
    }
    this_local._0_4_ = sched_disabled_bit;
  }
  return (uint32_t)this_local;
}

Assistant:

inline uint32_t SpinLock::TryLockInternal(uint32_t lock_value,
                                          uint32_t wait_cycles) {
  if ((lock_value & kSpinLockHeld) != 0) {
    return lock_value;
  }

  uint32_t sched_disabled_bit = 0;
  if ((lock_value & kSpinLockCooperative) == 0) {
    // For non-cooperative locks we must make sure we mark ourselves as
    // non-reschedulable before we attempt to CompareAndSwap.
    if (base_internal::SchedulingGuard::DisableRescheduling()) {
      sched_disabled_bit = kSpinLockDisabledScheduling;
    }
  }

  if (!lockword_.compare_exchange_strong(
          lock_value,
          kSpinLockHeld | lock_value | wait_cycles | sched_disabled_bit,
          std::memory_order_acquire, std::memory_order_relaxed)) {
    base_internal::SchedulingGuard::EnableRescheduling(sched_disabled_bit != 0);
  }

  return lock_value;
}